

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

bool __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::
FindHeapObjectImpl<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress,
          Recycler *recycler,FindHeapObjectFlags flags,RecyclerHeapObjectInfo *heapObject)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  BOOL BVar5;
  byte *pbVar6;
  undefined4 *puVar7;
  SmallHeapBlockBitVector *this_00;
  uint local_34;
  
  if (((flags & FindHeapObjectFlags_AllowInterior) == FindHeapObjectFlags_NoFlags) ||
     (objectAddress = GetRealAddressFromInterior(this,objectAddress),
     (byte *)objectAddress != (byte *)0x0)) {
    uVar4 = GetAddressIndex(this,objectAddress);
    if (uVar4 != 0xffff) {
      if (((flags & FindHeapObjectFlags_NoFreeBitVerify) == FindHeapObjectFlags_NoFlags) &&
         ((((flags & FindHeapObjectFlags_VerifyFreeBitForAttribute) == FindHeapObjectFlags_NoFlags
           || (bVar2 = HasPendingDisposeObjects(this), bVar2)) &&
          (BVar5 = Recycler::IsConcurrentSweepExecutingState(recycler), BVar5 == 0)))) {
        if ((flags & FindHeapObjectFlags_ClearedAllocators) == FindHeapObjectFlags_NoFlags) {
          if (this->isInAllocator == true) {
            HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
            UpdateAllocators((HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                              *)this->heapBucket);
          }
        }
        else {
          bVar2 = HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
                  AllocatorsAreEmpty((HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                                      *)this->heapBucket);
          if ((!bVar2) && (recycler->isHeapEnumInProgress == false)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                               ,0x28d,
                               "(((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress)"
                               ,
                               "((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress"
                              );
            if (!bVar2) goto LAB_00628315;
            *puVar7 = 0;
          }
        }
        this_00 = EnsureFreeBitVector(this,true);
        local_34 = (uint)uVar4;
        BVar3 = BVStatic<256UL>::Test(this_00,(this->objectSize >> 4) * local_34);
        if (BVar3 != '\0') {
          return false;
        }
      }
      pbVar6 = ObjectInfo(this,(uint)uVar4);
      heapObject->m_address = objectAddress;
      heapObject->m_recycler = recycler;
      heapObject->m_heapBlock = &this->super_HeapBlock;
      (heapObject->field_3).m_attributes = pbVar6;
      heapObject->isUsingLargeHeapBlock = false;
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x272,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                       "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
    if (!bVar2) {
LAB_00628315:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  return false;
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::FindHeapObjectImpl(void* objectAddress, Recycler * recycler, FindHeapObjectFlags flags, RecyclerHeapObjectInfo& heapObject)
{
    if (flags & FindHeapObjectFlags_AllowInterior)
    {
        objectAddress = (void*) this->GetRealAddressFromInterior(objectAddress);
        if (objectAddress == nullptr)
        {
            return false;
        }
    }

    ushort index = GetAddressIndex(objectAddress);
    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    if (index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return false;
    }

    // If we have pending object, we still need to check the free bit if the caller requested the attribute to be correct
    bool const disableCheck = ((flags & FindHeapObjectFlags_NoFreeBitVerify) != 0) ||
        ((flags & FindHeapObjectFlags_VerifyFreeBitForAttribute) != 0 && !this->HasPendingDisposeObjects());
    if (!disableCheck)
    {
        // REVIEW: Checking if an object if free is strictly not necessary
        // In all case, we should have a valid object, For memory protect heap, this is just to make sure we don't
        // free pointers that are invalid.
#if ENABLE_CONCURRENT_GC
        if (recycler->IsConcurrentSweepExecutingState())
        {
            // TODO: unless we know the state of the heap block, we don't know.
            // skip the check for now.
        }
        else
#endif
        {
            if (flags & FindHeapObjectFlags_ClearedAllocators)
            {
                // Heap enum has some case where it allocates, so we can't assert
                Assert(((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress);
            }
            else if (this->IsInAllocator())
            {
                ((HeapBucketT<TBlockType> *)this->heapBucket)->UpdateAllocators();
            }

            // REVIEW allocation heuristics
            if (this->EnsureFreeBitVector()->Test(this->GetObjectBitDelta() * index))
            {
                return false;
            }
        }
    }

    byte& attributes = ObjectInfo(index);
    heapObject = RecyclerHeapObjectInfo(objectAddress, recycler, this, &attributes);
    return true;
}